

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::RunContext::testGroupStarting
          (RunContext *this,string *testSpec,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  string asStack_58 [32];
  size_t local_38;
  size_t local_30;
  
  pIVar1 = Detail::unique_ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  std::__cxx11::string::string(asStack_58,(string *)testSpec);
  local_38 = groupIndex;
  local_30 = groupsCount;
  (*pIVar1->_vptr_IStreamingReporter[5])(pIVar1,asStack_58);
  std::__cxx11::string::~string(asStack_58);
  return;
}

Assistant:

void RunContext::testGroupStarting(std::string const &testSpec, std::size_t groupIndex, std::size_t groupsCount) {
        m_reporter->testGroupStarting(GroupInfo(testSpec, groupIndex, groupsCount));
    }